

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O1

bool __thiscall cmCTestUpdateHandler::SelectVCS(cmCTestUpdateHandler *this)

{
  char *pcVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  char *cmd;
  bool bVar4;
  int iVar5;
  string *dir;
  size_t sVar6;
  ostream *poVar7;
  ostringstream e;
  ostringstream cmCTestLog_msg;
  char *local_348;
  long *local_340;
  long local_338;
  long local_330 [2];
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  pcVar2 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"UpdateCommand","");
  cmCTest::GetCTestConfiguration((string *)local_320,pcVar3,(string *)local_1a8);
  std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)local_320);
  pcVar1 = local_320 + 0x10;
  if ((char *)local_320._0_8_ != pcVar1) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_320._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"SourceDirectory","");
  dir = (string *)
        cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,(string *)local_320);
  if (dir == (string *)0x0) {
    dir = &cmValue::Empty_abi_cxx11_;
  }
  iVar5 = DetectVCS(this,dir);
  this->UpdateType = iVar5;
  if ((char *)local_320._0_8_ != pcVar1) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if (this->UpdateType == 0) {
    cmd = (this->UpdateCommand)._M_dataplus._M_p;
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"UpdateType","");
    cmCTest::GetCTestConfiguration((string *)local_320,pcVar3,(string *)local_1a8);
    iVar5 = DetermineType(this,cmd,(char *)local_320._0_8_);
    this->UpdateType = iVar5;
    if ((char *)local_320._0_8_ != pcVar1) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if ((this->UpdateCommand)._M_string_length != 0) {
    return true;
  }
  switch(this->UpdateType) {
  case 1:
    local_348 = "CVSCommand";
    break;
  case 2:
    local_348 = "SVNCommand";
    break;
  case 3:
    local_348 = "BZRCommand";
    break;
  case 4:
    local_348 = "GITCommand";
    break;
  case 5:
    local_348 = "HGCommand";
    break;
  case 6:
    local_348 = "P4Command";
    break;
  default:
    bVar4 = true;
    local_348 = (char *)0x0;
    goto LAB_001e379f;
  }
  bVar4 = false;
LAB_001e379f:
  if (!bVar4) {
    pcVar3 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,local_348,(allocator<char> *)&local_340);
    cmCTest::GetCTestConfiguration((string *)local_320,pcVar3,(string *)local_1a8);
    std::__cxx11::string::operator=((string *)&this->UpdateCommand,(string *)local_320);
    if ((char *)local_320._0_8_ != pcVar1) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  if ((this->UpdateCommand)._M_string_length != 0) {
    return true;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"Cannot find UpdateCommand ",0x1a);
  if (!bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"or ",3);
    sVar6 = strlen(local_348);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,local_348,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320," configuration key.",0x13);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__cxx11::stringbuf::str();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(char *)local_340,local_338);
  std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  pcVar3 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,7,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x15c,(char *)local_340,false);
  if (local_340 != local_330) {
    operator_delete(local_340,local_330[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return false;
}

Assistant:

bool cmCTestUpdateHandler::SelectVCS()
{
  // Get update command
  this->UpdateCommand = this->CTest->GetCTestConfiguration("UpdateCommand");

  // Detect the VCS managing the source tree.
  this->UpdateType = this->DetectVCS(this->GetOption("SourceDirectory"));
  if (this->UpdateType == e_UNKNOWN) {
    // The source tree does not have a recognized VCS.  Check the
    // configuration value or command name.
    this->UpdateType = this->DetermineType(
      this->UpdateCommand.c_str(),
      this->CTest->GetCTestConfiguration("UpdateType").c_str());
  }

  // If no update command was specified, lookup one for this VCS tool.
  if (this->UpdateCommand.empty()) {
    const char* key = nullptr;
    switch (this->UpdateType) {
      case e_CVS:
        key = "CVSCommand";
        break;
      case e_SVN:
        key = "SVNCommand";
        break;
      case e_BZR:
        key = "BZRCommand";
        break;
      case e_GIT:
        key = "GITCommand";
        break;
      case e_HG:
        key = "HGCommand";
        break;
      case e_P4:
        key = "P4Command";
        break;
      default:
        break;
    }
    if (key) {
      this->UpdateCommand = this->CTest->GetCTestConfiguration(key);
    }
    if (this->UpdateCommand.empty()) {
      std::ostringstream e;
      e << "Cannot find UpdateCommand ";
      if (key) {
        e << "or " << key;
      }
      e << " configuration key.";
      cmCTestLog(this->CTest, ERROR_MESSAGE, e.str() << std::endl);
      return false;
    }
  }

  return true;
}